

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint getTreeInflateDynamic
               (HuffmanTree *tree_ll,HuffmanTree *tree_d,uchar *in,size_t *bp,size_t inlength)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong inbitlength_00;
  uint replength_2;
  uint replength_1;
  uint value;
  uint replength;
  uint code;
  HuffmanTree tree_cl;
  uint *bitlen_cl;
  uint *bitlen_d;
  uint *bitlen_ll;
  size_t inbitlength;
  uint i;
  uint HCLEN;
  uint HDIST;
  uint HLIT;
  uint n;
  uint error;
  size_t inlength_local;
  size_t *bp_local;
  uchar *in_local;
  HuffmanTree *tree_d_local;
  HuffmanTree *tree_ll_local;
  
  inbitlength_00 = inlength << 3;
  bitlen_d = (uint *)0x0;
  bitlen_cl = (uint *)0x0;
  tree_cl.maxbitlen = 0;
  tree_cl.numcodes = 0;
  if (inlength << 3 < *bp + 0xe) {
    tree_ll_local._4_4_ = 0x31;
  }
  else {
    uVar1 = readBitsFromStream(bp,in,5);
    uVar2 = uVar1 + 0x101;
    uVar3 = readBitsFromStream(bp,in,5);
    iVar4 = uVar3 + 1;
    uVar3 = readBitsFromStream(bp,in,4);
    if (inlength << 3 < *bp + (ulong)((uVar3 + 4) * 3)) {
      tree_ll_local._4_4_ = 0x32;
    }
    else {
      HuffmanTree_init((HuffmanTree *)&replength);
      tree_cl._24_8_ = lodepng_malloc(0x4c);
      if ((void *)tree_cl._24_8_ == (void *)0x0) {
        HLIT = 0x53;
      }
      else {
        for (inbitlength._0_4_ = 0; (uint)inbitlength != 0x13;
            inbitlength._0_4_ = (uint)inbitlength + 1) {
          if ((uint)inbitlength < uVar3 + 4) {
            uVar5 = readBitsFromStream(bp,in,3);
            *(uint *)(tree_cl._24_8_ + (ulong)CLCL_ORDER[(uint)inbitlength] * 4) = uVar5;
          }
          else {
            *(undefined4 *)(tree_cl._24_8_ + (ulong)CLCL_ORDER[(uint)inbitlength] * 4) = 0;
          }
        }
        HLIT = HuffmanTree_makeFromLengths((HuffmanTree *)&replength,(uint *)tree_cl._24_8_,0x13,7);
        if (HLIT == 0) {
          bitlen_d = (uint *)lodepng_malloc(0x480);
          bitlen_cl = (uint *)lodepng_malloc(0x80);
          if ((bitlen_d == (uint *)0x0) || (bitlen_cl == (uint *)0x0)) {
            HLIT = 0x53;
          }
          else {
            for (inbitlength._0_4_ = 0; (uint)inbitlength != 0x120;
                inbitlength._0_4_ = (uint)inbitlength + 1) {
              bitlen_d[(uint)inbitlength] = 0;
            }
            for (inbitlength._0_4_ = 0; (uint)inbitlength != 0x20;
                inbitlength._0_4_ = (uint)inbitlength + 1) {
              bitlen_cl[(uint)inbitlength] = 0;
            }
            inbitlength._0_4_ = 0;
LAB_00118f2c:
            if ((uint)inbitlength < uVar2 + iVar4) {
              uVar3 = huffmanDecodeSymbol(in,bp,(HuffmanTree *)&replength,inbitlength_00);
              if (uVar3 < 0x10) {
                if ((uint)inbitlength < uVar2) {
                  bitlen_d[(uint)inbitlength] = uVar3;
                }
                else {
                  bitlen_cl[(uint)inbitlength - uVar2] = uVar3;
                }
                inbitlength._0_4_ = (uint)inbitlength + 1;
              }
              else if (uVar3 == 0x10) {
                if ((uint)inbitlength == 0) {
                  HLIT = 0x36;
                  goto LAB_00119267;
                }
                if (inbitlength_00 < *bp + 2) {
                  HLIT = 0x32;
                  goto LAB_00119267;
                }
                uVar3 = readBitsFromStream(bp,in,2);
                if ((uint)inbitlength < uVar1 + 0x102) {
                  replength_2 = bitlen_d[(uint)inbitlength - 1];
                }
                else {
                  replength_2 = bitlen_cl[((uint)inbitlength - uVar2) - 1];
                }
                for (HDIST = 0; HDIST < uVar3 + 3; HDIST = HDIST + 1) {
                  if (uVar2 + iVar4 <= (uint)inbitlength) {
                    HLIT = 0xd;
                    break;
                  }
                  if ((uint)inbitlength < uVar2) {
                    bitlen_d[(uint)inbitlength] = replength_2;
                  }
                  else {
                    bitlen_cl[(uint)inbitlength - uVar2] = replength_2;
                  }
                  inbitlength._0_4_ = (uint)inbitlength + 1;
                }
              }
              else if (uVar3 == 0x11) {
                if (inbitlength_00 < *bp + 3) {
                  HLIT = 0x32;
                  goto LAB_00119267;
                }
                uVar3 = readBitsFromStream(bp,in,3);
                for (HDIST = 0; HDIST < uVar3 + 3; HDIST = HDIST + 1) {
                  if (uVar2 + iVar4 <= (uint)inbitlength) {
                    HLIT = 0xe;
                    break;
                  }
                  if ((uint)inbitlength < uVar2) {
                    bitlen_d[(uint)inbitlength] = 0;
                  }
                  else {
                    bitlen_cl[(uint)inbitlength - uVar2] = 0;
                  }
                  inbitlength._0_4_ = (uint)inbitlength + 1;
                }
              }
              else {
                if (uVar3 != 0x12) {
                  if (uVar3 == 0xffffffff) {
                    HLIT = 0xb;
                    if (inbitlength_00 < *bp) {
                      HLIT = 10;
                    }
                  }
                  else {
                    HLIT = 0x10;
                  }
                  goto LAB_00119267;
                }
                if (inbitlength_00 < *bp + 7) {
                  HLIT = 0x32;
                  goto LAB_00119267;
                }
                uVar3 = readBitsFromStream(bp,in,7);
                for (HDIST = 0; HDIST < uVar3 + 0xb; HDIST = HDIST + 1) {
                  if (uVar2 + iVar4 <= (uint)inbitlength) {
                    HLIT = 0xf;
                    break;
                  }
                  if ((uint)inbitlength < uVar2) {
                    bitlen_d[(uint)inbitlength] = 0;
                  }
                  else {
                    bitlen_cl[(uint)inbitlength - uVar2] = 0;
                  }
                  inbitlength._0_4_ = (uint)inbitlength + 1;
                }
              }
              goto LAB_00118f2c;
            }
LAB_00119267:
            if (HLIT == 0) {
              if (bitlen_d[0x100] == 0) {
                HLIT = 0x40;
              }
              else {
                HLIT = HuffmanTree_makeFromLengths(tree_ll,bitlen_d,0x120,0xf);
                if (HLIT == 0) {
                  HLIT = HuffmanTree_makeFromLengths(tree_d,bitlen_cl,0x20,0xf);
                }
              }
            }
          }
        }
      }
      lodepng_free((void *)tree_cl._24_8_);
      lodepng_free(bitlen_d);
      lodepng_free(bitlen_cl);
      HuffmanTree_cleanup((HuffmanTree *)&replength);
      tree_ll_local._4_4_ = HLIT;
    }
  }
  return tree_ll_local._4_4_;
}

Assistant:

static unsigned getTreeInflateDynamic(HuffmanTree* tree_ll, HuffmanTree* tree_d,
                                      const unsigned char* in, size_t* bp, size_t inlength)
{
  /*make sure that length values that aren't filled in will be 0, or a wrong tree will be generated*/
  unsigned error = 0;
  unsigned n, HLIT, HDIST, HCLEN, i;
  size_t inbitlength = inlength * 8;

  /*see comments in deflateDynamic for explanation of the context and these variables, it is analogous*/
  unsigned* bitlen_ll = 0; /*lit,len code lengths*/
  unsigned* bitlen_d = 0; /*dist code lengths*/
  /*code length code lengths ("clcl"), the bit lengths of the huffman tree used to compress bitlen_ll and bitlen_d*/
  unsigned* bitlen_cl = 0;
  HuffmanTree tree_cl; /*the code tree for code length codes (the huffman tree for compressed huffman trees)*/

  if((*bp) + 14 > (inlength << 3)) return 49; /*error: the bit pointer is or will go past the memory*/

  /*number of literal/length codes + 257. Unlike the spec, the value 257 is added to it here already*/
  HLIT =  readBitsFromStream(bp, in, 5) + 257;
  /*number of distance codes. Unlike the spec, the value 1 is added to it here already*/
  HDIST = readBitsFromStream(bp, in, 5) + 1;
  /*number of code length codes. Unlike the spec, the value 4 is added to it here already*/
  HCLEN = readBitsFromStream(bp, in, 4) + 4;

  if((*bp) + HCLEN * 3 > (inlength << 3)) return 50; /*error: the bit pointer is or will go past the memory*/

  HuffmanTree_init(&tree_cl);

  while(!error)
  {
    /*read the code length codes out of 3 * (amount of code length codes) bits*/

    bitlen_cl = (unsigned*)lodepng_malloc(NUM_CODE_LENGTH_CODES * sizeof(unsigned));
    if(!bitlen_cl) ERROR_BREAK(83 /*alloc fail*/);

    for(i = 0; i != NUM_CODE_LENGTH_CODES; ++i)
    {
      if(i < HCLEN) bitlen_cl[CLCL_ORDER[i]] = readBitsFromStream(bp, in, 3);
      else bitlen_cl[CLCL_ORDER[i]] = 0; /*if not, it must stay 0*/
    }

    error = HuffmanTree_makeFromLengths(&tree_cl, bitlen_cl, NUM_CODE_LENGTH_CODES, 7);
    if(error) break;

    /*now we can use this tree to read the lengths for the tree that this function will return*/
    bitlen_ll = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
    bitlen_d = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
    if(!bitlen_ll || !bitlen_d) ERROR_BREAK(83 /*alloc fail*/);
    for(i = 0; i != NUM_DEFLATE_CODE_SYMBOLS; ++i) bitlen_ll[i] = 0;
    for(i = 0; i != NUM_DISTANCE_SYMBOLS; ++i) bitlen_d[i] = 0;

    /*i is the current symbol we're reading in the part that contains the code lengths of lit/len and dist codes*/
    i = 0;
    while(i < HLIT + HDIST)
    {
      unsigned code = huffmanDecodeSymbol(in, bp, &tree_cl, inbitlength);
      if(code <= 15) /*a length code*/
      {
        if(i < HLIT) bitlen_ll[i] = code;
        else bitlen_d[i - HLIT] = code;
        ++i;
      }
      else if(code == 16) /*repeat previous*/
      {
        unsigned replength = 3; /*read in the 2 bits that indicate repeat length (3-6)*/
        unsigned value; /*set value to the previous code*/

        if(i == 0) ERROR_BREAK(54); /*can't repeat previous if i is 0*/

        if((*bp + 2) > inbitlength) ERROR_BREAK(50); /*error, bit pointer jumps past memory*/
        replength += readBitsFromStream(bp, in, 2);

        if(i < HLIT + 1) value = bitlen_ll[i - 1];
        else value = bitlen_d[i - HLIT - 1];
        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n)
        {
          if(i >= HLIT + HDIST) ERROR_BREAK(13); /*error: i is larger than the amount of codes*/
          if(i < HLIT) bitlen_ll[i] = value;
          else bitlen_d[i - HLIT] = value;
          ++i;
        }
      }
      else if(code == 17) /*repeat "0" 3-10 times*/
      {
        unsigned replength = 3; /*read in the bits that indicate repeat length*/
        if((*bp + 3) > inbitlength) ERROR_BREAK(50); /*error, bit pointer jumps past memory*/
        replength += readBitsFromStream(bp, in, 3);

        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n)
        {
          if(i >= HLIT + HDIST) ERROR_BREAK(14); /*error: i is larger than the amount of codes*/

          if(i < HLIT) bitlen_ll[i] = 0;
          else bitlen_d[i - HLIT] = 0;
          ++i;
        }
      }
      else if(code == 18) /*repeat "0" 11-138 times*/
      {
        unsigned replength = 11; /*read in the bits that indicate repeat length*/
        if((*bp + 7) > inbitlength) ERROR_BREAK(50); /*error, bit pointer jumps past memory*/
        replength += readBitsFromStream(bp, in, 7);

        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n)
        {
          if(i >= HLIT + HDIST) ERROR_BREAK(15); /*error: i is larger than the amount of codes*/

          if(i < HLIT) bitlen_ll[i] = 0;
          else bitlen_d[i - HLIT] = 0;
          ++i;
        }
      }
      else /*if(code == (unsigned)(-1))*/ /*huffmanDecodeSymbol returns (unsigned)(-1) in case of error*/
      {
        if(code == (unsigned)(-1))
        {
          /*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
          (10=no endcode, 11=wrong jump outside of tree)*/
          error = (*bp) > inbitlength ? 10 : 11;
        }
        else error = 16; /*unexisting code, this can never happen*/
        break;
      }
    }
    if(error) break;

    if(bitlen_ll[256] == 0) ERROR_BREAK(64); /*the length of the end code 256 must be larger than 0*/

    /*now we've finally got HLIT and HDIST, so generate the code trees, and the function is done*/
    error = HuffmanTree_makeFromLengths(tree_ll, bitlen_ll, NUM_DEFLATE_CODE_SYMBOLS, 15);
    if(error) break;
    error = HuffmanTree_makeFromLengths(tree_d, bitlen_d, NUM_DISTANCE_SYMBOLS, 15);

    break; /*end of error-while*/
  }

  lodepng_free(bitlen_cl);
  lodepng_free(bitlen_ll);
  lodepng_free(bitlen_d);
  HuffmanTree_cleanup(&tree_cl);

  return error;
}